

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::subtype<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  undefined8 *puVar1;
  undefined1 *puVar2;
  bool bVar3;
  string_view expected;
  string_view expected_00;
  string local_b8;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  MaybeResult<wasm::Ok> _val;
  MaybeResult<wasm::Ok> super;
  
  expected._M_str = "sub";
  expected._M_len = 3;
  bVar3 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar3) {
    expected_00._M_str = "final";
    expected_00._M_len = 5;
    Lexer::takeKeyword(&ctx->in,expected_00);
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
    maybeTypeidx<wasm::WATParser::ParseDeclsCtx>
              ((MaybeResult<wasm::Ok> *)__return_storage_ptr___00,ctx);
    if (super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ != '\x01') {
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_78,
                      (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
        local_98 = &local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_78,
                   _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ +
                   (long)local_78);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if (local_98 == &local_88) {
          *puVar1 = CONCAT71(uStack_87,local_88);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_80;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_98;
          *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(uStack_87,local_88);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_90;
        local_90 = 0;
        local_88 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        local_98 = &local_88;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_78);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                          ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        return __return_storage_ptr__;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_78);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    sharecomptype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)__return_storage_ptr___00,ctx)
    ;
    if (super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
      puVar2 = (undefined1 *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
      local_78 = (undefined1  [8])puVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,
                 _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_,
                 super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ +
                 _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
      if (local_78 == (undefined1  [8])puVar2) {
        *puVar1 = CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_,
                           _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_)
        ;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
             _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_78;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_,
                      _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
           _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
      _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
      _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      local_78 = (undefined1  [8])puVar2;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      return __return_storage_ptr__;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    bVar3 = Lexer::takeRParen(&ctx->in);
    if (!bVar3) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"expected end of subtype definition","");
      Lexer::err((Err *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                 &ctx->in,&local_b8);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
      puVar2 = (undefined1 *)
               ((long)&super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
      if ((undefined1 *)
          _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ == puVar2) {
        *puVar1 = CONCAT71(super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_,
                           super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_)
        ;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
             super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
             _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_,
                      super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
           super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
      super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
      super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
        return __return_storage_ptr__;
      }
      _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ = puVar2;
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
  }
  else {
    sharecomptype<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx);
    if (super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
      puVar2 = (undefined1 *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8);
      local_78 = (undefined1  [8])puVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,
                 _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_,
                 super.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ +
                 _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
      if (local_78 == (undefined1  [8])puVar2) {
        *puVar1 = CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_,
                           _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_)
        ;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
             _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_78;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._9_7_,
                      _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
           _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
      _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
      _val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      local_78 = (undefined1  [8])puVar2;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      return __return_storage_ptr__;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<> subtype(Ctx& ctx) {
  if (ctx.in.takeSExprStart("sub"sv)) {
    if (!ctx.in.takeKeyword("final"sv)) {
      ctx.setOpen();
    }
    if (auto super = maybeTypeidx(ctx)) {
      CHECK_ERR(super);
      ctx.setSupertype(*super);
    }

    CHECK_ERR(sharecomptype(ctx));

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of subtype definition");
    }
  } else {
    CHECK_ERR(sharecomptype(ctx));
  }
  return Ok{};
}